

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall
testing::internal::anon_unknown_28::UnitTestFilter::MatchesName(UnitTestFilter *this,string *name)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  bool local_41;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_20;
  anon_class_8_1_898f2789_for__M_pred local_18;
  string *name_local;
  UnitTestFilter *this_local;
  
  local_18.name = name;
  name_local = (string *)this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->exact_match_patterns_,name);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->exact_match_patterns_);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  local_41 = true;
  if (!bVar1) {
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&this->glob_patterns_);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->glob_patterns_);
    local_41 = std::
               any_of<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                         ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )__first._M_current,
                          (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )__last._M_current,local_18);
  }
  return local_41;
}

Assistant:

bool MatchesName(const std::string& name) const {
    return exact_match_patterns_.find(name) != exact_match_patterns_.end() ||
           std::any_of(glob_patterns_.begin(), glob_patterns_.end(),
                       [&name](const std::string& pattern) {
                         return PatternMatchesString(
                             name, pattern.c_str(),
                             pattern.c_str() + pattern.size());
                       });
  }